

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BorderagentGetLocator_Test::
InterpreterTestSuite_PC_BorderagentGetLocator_Test
          (InterpreterTestSuite_PC_BorderagentGetLocator_Test *this)

{
  InterpreterTestSuite_PC_BorderagentGetLocator_Test *this_local;
  
  InterpreterTestSuite::InterpreterTestSuite(&this->super_InterpreterTestSuite);
  (this->super_InterpreterTestSuite).super_Test._vptr_Test =
       (_func_int **)&PTR__InterpreterTestSuite_PC_BorderagentGetLocator_Test_005b4fa0;
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BorderagentGetLocator)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetBorderAgentLocator(_)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("borderagent get locator");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}